

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

string * __thiscall
cfd::core::BlindFactor::GetHex_abi_cxx11_(string *__return_storage_ptr__,BlindFactor *this)

{
  allocator<unsigned_char> local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58 [8];
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  BlindFactor *this_local;
  
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&this->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crbegin(local_58);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::crend(local_60);
  ::std::allocator<unsigned_char>::allocator(&local_61);
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_50,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_58,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_60,&local_61);
  ::std::allocator<unsigned_char>::~allocator(&local_61);
  StringUtil::ByteToString_abi_cxx11_
            ((StringUtil *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string BlindFactor::GetHex() const {
  const std::vector<uint8_t> &data = data_.GetBytes();
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  return StringUtil::ByteToString(reverse_buffer);
}